

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

void ppack(FILE *fdes,ck_msg_type type,CheckMsg *msg)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t r;
  char *pcStack_28;
  int n;
  char *buf;
  CheckMsg *msg_local;
  FILE *pFStack_10;
  ck_msg_type type_local;
  FILE *fdes_local;
  
  pcStack_28 = (char *)0x0;
  buf = (char *)msg;
  msg_local._4_4_ = type;
  pFStack_10 = (FILE *)fdes;
  iVar1 = pack(type,&stack0xffffffffffffffd8,msg);
  if (iVar1 < 0) {
    eprintf("pack failed",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
            ,0x16d);
  }
  sVar2 = get_max_msg_size();
  if (sVar2 < (ulong)(long)iVar1) {
    eprintf("Message string too long",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
            ,0x16d);
  }
  sVar3 = fwrite(pcStack_28,1,(long)iVar1,pFStack_10);
  fflush(pFStack_10);
  if (sVar3 != (long)iVar1) {
    eprintf("Error in call to fwrite:",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
            ,0x176);
  }
  free(pcStack_28);
  return;
}

Assistant:

void ppack(FILE * fdes, enum ck_msg_type type, CheckMsg * msg)
{
    char *buf = NULL;
    int n;
    size_t r;

    n = pack(type, &buf, msg);
    if(n < 0)
        eprintf("pack failed", __FILE__, __LINE__ - 2);
    /* Keep it on the safe side to not send too much data. */
    if((size_t) n > get_max_msg_size())
        eprintf("Message string too long", __FILE__, __LINE__ - 5);

    pthread_cleanup_push(ppack_cleanup, &ck_mutex_lock);
    pthread_mutex_lock(&ck_mutex_lock);
    r = fwrite(buf, 1, (size_t) n, fdes);
    fflush(fdes);
    pthread_mutex_unlock(&ck_mutex_lock);
    pthread_cleanup_pop(0);
    if(r != (size_t) n)
        eprintf("Error in call to fwrite:", __FILE__, __LINE__ - 5);

    free(buf);
}